

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  byte bVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  uint uVar74;
  undefined1 (*pauVar75) [16];
  long lVar76;
  long lVar77;
  int iVar78;
  long lVar79;
  ulong uVar80;
  undefined1 (*pauVar81) [16];
  ulong uVar82;
  long lVar83;
  undefined1 (*pauVar84) [16];
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  uint uVar90;
  long lVar91;
  ulong uVar92;
  AABBNodeMB4D *node1;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  undefined1 (*pauVar96) [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar110;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar122;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar148;
  undefined1 auVar147 [64];
  float fVar155;
  undefined1 auVar150 [16];
  float fVar149;
  undefined1 auVar151 [32];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [64];
  float fVar159;
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  float fVar166;
  uint uVar167;
  float fVar168;
  uint uVar169;
  float fVar170;
  uint uVar171;
  float fVar172;
  uint uVar173;
  uint uVar174;
  undefined1 auVar161 [64];
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar176 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [64];
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29a0 [32];
  float local_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  undefined1 local_2950 [16];
  undefined1 (*local_2940) [16];
  long local_2938;
  ulong local_2930;
  ulong local_2928;
  ulong local_2920;
  long local_2918;
  ulong local_2910;
  ulong local_2908;
  ulong local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  undefined1 local_28e0 [32];
  RTCFilterFunctionNArguments local_28b0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined1 local_2810 [8];
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  undefined1 local_27f0 [8];
  float fStack_27e8;
  float fStack_27e4;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  undefined1 local_27d0 [8];
  float fStack_27c8;
  float fStack_27c4;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  undefined1 local_27b0 [8];
  float fStack_27a8;
  float fStack_27a4;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  RTCHitN local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined4 local_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined4 uStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar132 [64];
  
  pauVar75 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23e0._4_4_ = uVar3;
  local_23e0._0_4_ = uVar3;
  local_23e0._8_4_ = uVar3;
  local_23e0._12_4_ = uVar3;
  local_23e0._16_4_ = uVar3;
  local_23e0._20_4_ = uVar3;
  local_23e0._24_4_ = uVar3;
  local_23e0._28_4_ = uVar3;
  auVar143 = ZEXT3264(local_23e0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = uVar3;
  local_2400._0_4_ = uVar3;
  local_2400._8_4_ = uVar3;
  local_2400._12_4_ = uVar3;
  local_2400._16_4_ = uVar3;
  local_2400._20_4_ = uVar3;
  local_2400._24_4_ = uVar3;
  local_2400._28_4_ = uVar3;
  auVar147 = ZEXT3264(local_2400);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = uVar3;
  local_2420._0_4_ = uVar3;
  local_2420._8_4_ = uVar3;
  local_2420._12_4_ = uVar3;
  local_2420._16_4_ = uVar3;
  local_2420._20_4_ = uVar3;
  local_2420._24_4_ = uVar3;
  local_2420._28_4_ = uVar3;
  auVar152 = ZEXT3264(local_2420);
  uVar3 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4);
  local_2440._4_4_ = uVar3;
  local_2440._0_4_ = uVar3;
  local_2440._8_4_ = uVar3;
  local_2440._12_4_ = uVar3;
  local_2440._16_4_ = uVar3;
  local_2440._20_4_ = uVar3;
  local_2440._24_4_ = uVar3;
  local_2440._28_4_ = uVar3;
  auVar161 = ZEXT3264(local_2440);
  uVar3 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2460._4_4_ = uVar3;
  local_2460._0_4_ = uVar3;
  local_2460._8_4_ = uVar3;
  local_2460._12_4_ = uVar3;
  local_2460._16_4_ = uVar3;
  local_2460._20_4_ = uVar3;
  local_2460._24_4_ = uVar3;
  local_2460._28_4_ = uVar3;
  auVar176 = ZEXT3264(local_2460);
  uVar3 = *(undefined4 *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2480._4_4_ = uVar3;
  local_2480._0_4_ = uVar3;
  local_2480._8_4_ = uVar3;
  local_2480._12_4_ = uVar3;
  local_2480._16_4_ = uVar3;
  local_2480._20_4_ = uVar3;
  local_2480._24_4_ = uVar3;
  local_2480._28_4_ = uVar3;
  auVar184 = ZEXT3264(local_2480);
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar92 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_28e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar95 = local_28e8 ^ 0x20;
  iVar78 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar78;
  local_24a0._0_4_ = iVar78;
  local_24a0._8_4_ = iVar78;
  local_24a0._12_4_ = iVar78;
  local_24a0._16_4_ = iVar78;
  local_24a0._20_4_ = iVar78;
  local_24a0._24_4_ = iVar78;
  local_24a0._28_4_ = iVar78;
  auVar186 = ZEXT3264(local_24a0);
  iVar78 = (tray->tfar).field_0.i[k];
  auVar107 = ZEXT3264(CONCAT428(iVar78,CONCAT424(iVar78,CONCAT420(iVar78,CONCAT416(iVar78,CONCAT412(
                                                  iVar78,CONCAT48(iVar78,CONCAT44(iVar78,iVar78)))))
                                                )));
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2940 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar129._8_4_ = 0x3f800000;
  auVar129._0_8_ = 0x3f8000003f800000;
  auVar129._12_4_ = 0x3f800000;
  auVar129._16_4_ = 0x3f800000;
  auVar129._20_4_ = 0x3f800000;
  auVar129._24_4_ = 0x3f800000;
  auVar129._28_4_ = 0x3f800000;
  auVar132 = ZEXT3264(auVar129);
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar115._16_4_ = 0xbf800000;
  auVar115._20_4_ = 0xbf800000;
  auVar115._24_4_ = 0xbf800000;
  auVar115._28_4_ = 0xbf800000;
  _local_24e0 = vblendvps_avx(auVar129,auVar115,local_24c0);
LAB_00415205:
  do {
    pauVar96 = pauVar75 + -1;
    auVar121 = ZEXT464((uint)*(float *)(*pauVar96 + 8));
    pauVar75 = pauVar75 + -1;
    if (*(float *)(*pauVar96 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar82 = *(ulong *)*pauVar75;
      while ((uVar82 & 8) == 0) {
        uVar93 = uVar82 & 0xfffffffffffffff0;
        fVar97 = *(float *)(ray + k * 4 + 0x70);
        auVar125._4_4_ = fVar97;
        auVar125._0_4_ = fVar97;
        auVar125._8_4_ = fVar97;
        auVar125._12_4_ = fVar97;
        auVar125._16_4_ = fVar97;
        auVar125._20_4_ = fVar97;
        auVar125._24_4_ = fVar97;
        auVar125._28_4_ = fVar97;
        pfVar2 = (float *)(uVar93 + 0x100 + uVar85);
        pfVar1 = (float *)(uVar93 + 0x40 + uVar85);
        auVar116._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar116._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar116._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar116._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar116._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar116._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar116._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar116._28_4_ = auVar121._28_4_ + pfVar1[7];
        auVar141 = auVar143._0_32_;
        auVar115 = vsubps_avx(auVar116,auVar141);
        auVar47._4_4_ = auVar161._4_4_ * auVar115._4_4_;
        auVar47._0_4_ = auVar161._0_4_ * auVar115._0_4_;
        auVar47._8_4_ = auVar161._8_4_ * auVar115._8_4_;
        auVar47._12_4_ = auVar161._12_4_ * auVar115._12_4_;
        auVar47._16_4_ = auVar161._16_4_ * auVar115._16_4_;
        auVar47._20_4_ = auVar161._20_4_ * auVar115._20_4_;
        auVar47._24_4_ = auVar161._24_4_ * auVar115._24_4_;
        auVar47._28_4_ = auVar115._28_4_;
        auVar115 = vmaxps_avx(auVar186._0_32_,auVar47);
        pfVar2 = (float *)(uVar93 + 0x100 + uVar92);
        pfVar1 = (float *)(uVar93 + 0x40 + uVar92);
        auVar130._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar130._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar130._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar130._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar130._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar130._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar130._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar130._28_4_ = auVar132._28_4_ + pfVar1[7];
        auVar116 = auVar147._0_32_;
        auVar129 = vsubps_avx(auVar130,auVar116);
        auVar48._4_4_ = auVar176._4_4_ * auVar129._4_4_;
        auVar48._0_4_ = auVar176._0_4_ * auVar129._0_4_;
        auVar48._8_4_ = auVar176._8_4_ * auVar129._8_4_;
        auVar48._12_4_ = auVar176._12_4_ * auVar129._12_4_;
        auVar48._16_4_ = auVar176._16_4_ * auVar129._16_4_;
        auVar48._20_4_ = auVar176._20_4_ * auVar129._20_4_;
        auVar48._24_4_ = auVar176._24_4_ * auVar129._24_4_;
        auVar48._28_4_ = auVar129._28_4_;
        pfVar2 = (float *)(uVar93 + 0x100 + local_28e8);
        pfVar1 = (float *)(uVar93 + 0x40 + local_28e8);
        auVar135._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar135._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar135._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar135._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar135._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar135._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar135._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar135._28_4_ = in_ZMM4._28_4_ + pfVar1[7];
        auVar130 = auVar152._0_32_;
        auVar47 = vsubps_avx(auVar135,auVar130);
        auVar49._4_4_ = auVar184._4_4_ * auVar47._4_4_;
        auVar49._0_4_ = auVar184._0_4_ * auVar47._0_4_;
        auVar49._8_4_ = auVar184._8_4_ * auVar47._8_4_;
        auVar49._12_4_ = auVar184._12_4_ * auVar47._12_4_;
        auVar49._16_4_ = auVar184._16_4_ * auVar47._16_4_;
        auVar49._20_4_ = auVar184._20_4_ * auVar47._20_4_;
        auVar49._24_4_ = auVar184._24_4_ * auVar47._24_4_;
        auVar49._28_4_ = auVar47._28_4_;
        auVar129 = vmaxps_avx(auVar48,auVar49);
        local_26c0 = vmaxps_avx(auVar115,auVar129);
        pfVar2 = (float *)(uVar93 + 0x100 + (uVar85 ^ 0x20));
        pfVar1 = (float *)(uVar93 + 0x40 + (uVar85 ^ 0x20));
        auVar131._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar131._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar131._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar131._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar131._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar131._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar131._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar131._28_4_ = auVar129._28_4_ + pfVar1[7];
        auVar115 = vsubps_avx(auVar131,auVar141);
        auVar50._4_4_ = auVar161._4_4_ * auVar115._4_4_;
        auVar50._0_4_ = auVar161._0_4_ * auVar115._0_4_;
        auVar50._8_4_ = auVar161._8_4_ * auVar115._8_4_;
        auVar50._12_4_ = auVar161._12_4_ * auVar115._12_4_;
        auVar50._16_4_ = auVar161._16_4_ * auVar115._16_4_;
        auVar50._20_4_ = auVar161._20_4_ * auVar115._20_4_;
        auVar50._24_4_ = auVar161._24_4_ * auVar115._24_4_;
        auVar50._28_4_ = auVar115._28_4_;
        pfVar2 = (float *)(uVar93 + 0x100 + (uVar92 ^ 0x20));
        pfVar1 = (float *)(uVar93 + 0x40 + (uVar92 ^ 0x20));
        auVar136._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar136._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar136._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar136._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar136._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar136._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar136._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar136._28_4_ = auVar47._28_4_ + pfVar1[7];
        auVar115 = vsubps_avx(auVar136,auVar116);
        auVar51._4_4_ = auVar176._4_4_ * auVar115._4_4_;
        auVar51._0_4_ = auVar176._0_4_ * auVar115._0_4_;
        auVar51._8_4_ = auVar176._8_4_ * auVar115._8_4_;
        auVar51._12_4_ = auVar176._12_4_ * auVar115._12_4_;
        auVar51._16_4_ = auVar176._16_4_ * auVar115._16_4_;
        auVar51._20_4_ = auVar176._20_4_ * auVar115._20_4_;
        auVar51._24_4_ = auVar176._24_4_ * auVar115._24_4_;
        auVar51._28_4_ = auVar115._28_4_;
        pfVar2 = (float *)(uVar93 + 0x100 + uVar95);
        pfVar1 = (float *)(uVar93 + 0x40 + uVar95);
        auVar139._0_4_ = fVar97 * *pfVar2 + *pfVar1;
        auVar139._4_4_ = fVar97 * pfVar2[1] + pfVar1[1];
        auVar139._8_4_ = fVar97 * pfVar2[2] + pfVar1[2];
        auVar139._12_4_ = fVar97 * pfVar2[3] + pfVar1[3];
        auVar139._16_4_ = fVar97 * pfVar2[4] + pfVar1[4];
        auVar139._20_4_ = fVar97 * pfVar2[5] + pfVar1[5];
        auVar139._24_4_ = fVar97 * pfVar2[6] + pfVar1[6];
        auVar139._28_4_ = in_ZMM5._28_4_ + pfVar1[7];
        auVar115 = vsubps_avx(auVar139,auVar130);
        auVar58._4_4_ = auVar184._4_4_ * auVar115._4_4_;
        auVar58._0_4_ = auVar184._0_4_ * auVar115._0_4_;
        auVar58._8_4_ = auVar184._8_4_ * auVar115._8_4_;
        auVar58._12_4_ = auVar184._12_4_ * auVar115._12_4_;
        auVar58._16_4_ = auVar184._16_4_ * auVar115._16_4_;
        auVar58._20_4_ = auVar184._20_4_ * auVar115._20_4_;
        auVar58._24_4_ = auVar184._24_4_ * auVar115._24_4_;
        auVar58._28_4_ = auVar115._28_4_;
        in_ZMM5 = ZEXT3264(auVar58);
        auVar129 = vminps_avx(auVar51,auVar58);
        auVar115 = vminps_avx(auVar107._0_32_,auVar50);
        auVar115 = vminps_avx(auVar115,auVar129);
        auVar115 = vcmpps_avx(local_26c0,auVar115,2);
        auVar132 = ZEXT3264(auVar115);
        if (((uint)uVar82 & 7) == 6) {
          auVar129 = vcmpps_avx(*(undefined1 (*) [32])(uVar93 + 0x1c0),auVar125,2);
          auVar47 = vcmpps_avx(auVar125,*(undefined1 (*) [32])(uVar93 + 0x1e0),1);
          auVar47 = vandps_avx(auVar129,auVar47);
          auVar115 = vandps_avx(auVar47,auVar115);
          auVar132 = ZEXT1664(auVar115._16_16_);
          auVar123 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        }
        else {
          auVar123 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        }
        in_ZMM4 = ZEXT3264(auVar129);
        auVar123 = vpsllw_avx(auVar123,0xf);
        if ((((((((auVar123 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar123 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar123 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar123 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar123 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar123 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar123 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar123[0xf]) {
          if (pauVar75 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_00415205;
        }
        auVar123 = vpacksswb_avx(auVar123,auVar123);
        auVar121 = ZEXT1664(auVar123);
        bVar57 = SUB161(auVar123 >> 7,0) & 1 | (SUB161(auVar123 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar123 >> 0x17,0) & 1) << 2 | (SUB161(auVar123 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar123 >> 0x27,0) & 1) << 4 | (SUB161(auVar123 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar123 >> 0x37,0) & 1) << 6 | SUB161(auVar123 >> 0x3f,0) << 7;
        lVar77 = 0;
        if (bVar57 != 0) {
          for (; (bVar57 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
          }
        }
        uVar82 = *(ulong *)(uVar93 + lVar77 * 8);
        uVar90 = bVar57 - 1 & (uint)bVar57;
        if (uVar90 != 0) {
          uVar74 = *(uint *)(local_26c0 + lVar77 * 4);
          lVar77 = 0;
          if (uVar90 != 0) {
            for (; (uVar90 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
            }
          }
          uVar80 = *(ulong *)(uVar93 + lVar77 * 8);
          uVar164 = *(uint *)(local_26c0 + lVar77 * 4);
          uVar90 = uVar90 - 1 & uVar90;
          if (uVar90 == 0) {
            if (uVar74 < uVar164) {
              *(ulong *)*pauVar75 = uVar80;
              *(uint *)(*pauVar75 + 8) = uVar164;
              pauVar75 = pauVar75 + 1;
            }
            else {
              *(ulong *)*pauVar75 = uVar82;
              *(uint *)(*pauVar75 + 8) = uVar74;
              pauVar75 = pauVar75 + 1;
              uVar82 = uVar80;
            }
          }
          else {
            auVar123._8_8_ = 0;
            auVar123._0_8_ = uVar82;
            auVar123 = vpunpcklqdq_avx(auVar123,ZEXT416(uVar74));
            auVar114._8_8_ = 0;
            auVar114._0_8_ = uVar80;
            auVar114 = vpunpcklqdq_avx(auVar114,ZEXT416(uVar164));
            lVar77 = 0;
            if (uVar90 != 0) {
              for (; (uVar90 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
              }
            }
            auVar99._8_8_ = 0;
            auVar99._0_8_ = *(ulong *)(uVar93 + lVar77 * 8);
            auVar150 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_26c0 + lVar77 * 4)));
            auVar132 = ZEXT1664(auVar150);
            auVar99 = vpcmpgtd_avx(auVar114,auVar123);
            in_ZMM4 = ZEXT1664(auVar99);
            uVar90 = uVar90 - 1 & uVar90;
            if (uVar90 == 0) {
              auVar137 = vpshufd_avx(auVar99,0xaa);
              auVar99 = vblendvps_avx(auVar114,auVar123,auVar137);
              auVar123 = vblendvps_avx(auVar123,auVar114,auVar137);
              auVar114 = vpcmpgtd_avx(auVar150,auVar99);
              auVar137 = vpshufd_avx(auVar114,0xaa);
              auVar114 = vblendvps_avx(auVar150,auVar99,auVar137);
              in_ZMM4 = ZEXT1664(auVar114);
              auVar99 = vblendvps_avx(auVar99,auVar150,auVar137);
              auVar150 = vpcmpgtd_avx(auVar99,auVar123);
              auVar137 = vpshufd_avx(auVar150,0xaa);
              auVar132 = ZEXT1664(auVar137);
              auVar150 = vblendvps_avx(auVar99,auVar123,auVar137);
              in_ZMM5 = ZEXT1664(auVar150);
              auVar123 = vblendvps_avx(auVar123,auVar99,auVar137);
              auVar121 = ZEXT1664(auVar123);
              *pauVar75 = auVar123;
              pauVar75[1] = auVar150;
              uVar82 = auVar114._0_8_;
              pauVar75 = pauVar75 + 2;
            }
            else {
              lVar77 = 0;
              if (uVar90 != 0) {
                for (; (uVar90 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
                }
              }
              auVar137._8_8_ = 0;
              auVar137._0_8_ = *(ulong *)(uVar93 + lVar77 * 8);
              auVar137 = vpunpcklqdq_avx(auVar137,ZEXT416(*(uint *)(local_26c0 + lVar77 * 4)));
              in_ZMM5 = ZEXT1664(auVar137);
              uVar90 = uVar90 - 1 & uVar90;
              uVar80 = (ulong)uVar90;
              if (uVar90 == 0) {
                auVar98 = vpshufd_avx(auVar99,0xaa);
                auVar99 = vblendvps_avx(auVar114,auVar123,auVar98);
                auVar123 = vblendvps_avx(auVar123,auVar114,auVar98);
                auVar114 = vpcmpgtd_avx(auVar137,auVar150);
                auVar98 = vpshufd_avx(auVar114,0xaa);
                auVar114 = vblendvps_avx(auVar137,auVar150,auVar98);
                auVar150 = vblendvps_avx(auVar150,auVar137,auVar98);
                auVar137 = vpcmpgtd_avx(auVar150,auVar123);
                auVar98 = vpshufd_avx(auVar137,0xaa);
                auVar137 = vblendvps_avx(auVar150,auVar123,auVar98);
                in_ZMM5 = ZEXT1664(auVar137);
                auVar123 = vblendvps_avx(auVar123,auVar150,auVar98);
                auVar121 = ZEXT1664(auVar123);
                auVar150 = vpcmpgtd_avx(auVar114,auVar99);
                auVar98 = vpshufd_avx(auVar150,0xaa);
                auVar150 = vblendvps_avx(auVar114,auVar99,auVar98);
                auVar132 = ZEXT1664(auVar150);
                auVar114 = vblendvps_avx(auVar99,auVar114,auVar98);
                auVar99 = vpcmpgtd_avx(auVar137,auVar114);
                auVar98 = vpshufd_avx(auVar99,0xaa);
                in_ZMM4 = ZEXT1664(auVar98);
                auVar99 = vblendvps_avx(auVar137,auVar114,auVar98);
                auVar114 = vblendvps_avx(auVar114,auVar137,auVar98);
                *pauVar75 = auVar123;
                pauVar75[1] = auVar114;
                pauVar75[2] = auVar99;
                uVar82 = auVar150._0_8_;
                pauVar96 = pauVar75 + 3;
              }
              else {
                *pauVar75 = auVar123;
                pauVar75[1] = auVar114;
                pauVar75[2] = auVar150;
                pauVar75[3] = auVar137;
                lVar77 = 0x30;
                do {
                  lVar83 = lVar77;
                  lVar77 = 0;
                  if (uVar80 != 0) {
                    for (; (uVar80 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
                    }
                  }
                  uVar82 = *(ulong *)(uVar93 + lVar77 * 8);
                  auVar150._8_8_ = 0;
                  auVar150._0_8_ = uVar82;
                  auVar123 = vpunpcklqdq_avx(auVar150,ZEXT416(*(uint *)(local_26c0 + lVar77 * 4)));
                  auVar121 = ZEXT1664(auVar123);
                  *(undefined1 (*) [16])(pauVar75[1] + lVar83) = auVar123;
                  uVar80 = uVar80 & uVar80 - 1;
                  lVar77 = lVar83 + 0x10;
                } while (uVar80 != 0);
                pauVar96 = (undefined1 (*) [16])(pauVar75[1] + lVar83);
                if (lVar83 + 0x10 != 0) {
                  lVar77 = 0x10;
                  pauVar81 = pauVar75;
                  do {
                    auVar123 = pauVar81[1];
                    auVar121 = ZEXT1664(auVar123);
                    pauVar81 = pauVar81 + 1;
                    uVar90 = vextractps_avx(auVar123,2);
                    lVar83 = lVar77;
                    do {
                      if (uVar90 <= *(uint *)(pauVar75[-1] + lVar83 + 8)) {
                        pauVar84 = (undefined1 (*) [16])(*pauVar75 + lVar83);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar75 + lVar83) =
                           *(undefined1 (*) [16])(pauVar75[-1] + lVar83);
                      lVar83 = lVar83 + -0x10;
                      pauVar84 = pauVar75;
                    } while (lVar83 != 0);
                    *pauVar84 = auVar123;
                    lVar77 = lVar77 + 0x10;
                  } while (pauVar96 != pauVar81);
                  uVar82 = *(ulong *)*pauVar96;
                }
              }
              auVar143 = ZEXT3264(auVar141);
              auVar147 = ZEXT3264(auVar116);
              auVar152 = ZEXT3264(auVar130);
              auVar161 = ZEXT3264(auVar161._0_32_);
              auVar176 = ZEXT3264(auVar176._0_32_);
              auVar184 = ZEXT3264(auVar184._0_32_);
              auVar186 = ZEXT3264(auVar186._0_32_);
              pauVar75 = pauVar96;
            }
          }
        }
      }
      local_2938 = (ulong)((uint)uVar82 & 0xf) - 8;
      if (local_2938 != 0) {
        uVar82 = uVar82 & 0xfffffffffffffff0;
        lVar77 = 0;
        do {
          lVar76 = lVar77 * 0x60;
          pSVar6 = context->scene;
          pRVar7 = (pSVar6->geometries).items;
          pGVar8 = pRVar7[*(uint *)(uVar82 + 0x40 + lVar76)].ptr;
          fVar97 = (pGVar8->time_range).lower;
          fVar97 = pGVar8->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar97) /
                   ((pGVar8->time_range).upper - fVar97));
          auVar123 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),9);
          auVar123 = vminss_avx(auVar123,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar201 = vmaxss_avx(ZEXT816(0) << 0x20,auVar123);
          iVar78 = (int)auVar201._0_4_;
          lVar91 = (long)iVar78 * 0x38;
          lVar83 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar91);
          local_2908 = (ulong)*(uint *)(uVar82 + 4 + lVar76);
          auVar123 = *(undefined1 (*) [16])(lVar83 + (ulong)*(uint *)(uVar82 + lVar76) * 4);
          uVar80 = (ulong)*(uint *)(uVar82 + 0x10 + lVar76);
          auVar114 = *(undefined1 (*) [16])(lVar83 + uVar80 * 4);
          uVar86 = (ulong)*(uint *)(uVar82 + 0x20 + lVar76);
          auVar99 = *(undefined1 (*) [16])(lVar83 + uVar86 * 4);
          uVar87 = (ulong)*(uint *)(uVar82 + 0x30 + lVar76);
          auVar150 = *(undefined1 (*) [16])(lVar83 + uVar87 * 4);
          local_2918 = *(long *)&pRVar7[*(uint *)(uVar82 + 0x44 + lVar76)].ptr[2].numPrimitives;
          lVar83 = *(long *)(local_2918 + lVar91);
          auVar137 = *(undefined1 (*) [16])(lVar83 + local_2908 * 4);
          local_28f8 = (ulong)*(uint *)(uVar82 + 0x14 + lVar76);
          auVar98 = *(undefined1 (*) [16])(lVar83 + local_28f8 * 4);
          local_28f0 = (ulong)*(uint *)(uVar82 + 0x24 + lVar76);
          auVar133 = *(undefined1 (*) [16])(lVar83 + local_28f0 * 4);
          uVar88 = (ulong)*(uint *)(uVar82 + 0x34 + lVar76);
          auVar134 = *(undefined1 (*) [16])(lVar83 + uVar88 * 4);
          lVar83 = *(long *)&pRVar7[*(uint *)(uVar82 + 0x48 + lVar76)].ptr[2].numPrimitives;
          lVar9 = *(long *)(lVar83 + lVar91);
          uVar89 = (ulong)*(uint *)(uVar82 + 8 + lVar76);
          auVar138 = *(undefined1 (*) [16])(lVar9 + uVar89 * 4);
          local_2920 = (ulong)*(uint *)(uVar82 + 0x18 + lVar76);
          auVar124 = *(undefined1 (*) [16])(lVar9 + local_2920 * 4);
          local_2910 = (ulong)*(uint *)(uVar82 + 0x28 + lVar76);
          auVar144 = *(undefined1 (*) [16])(lVar9 + local_2910 * 4);
          local_2900 = (ulong)*(uint *)(uVar82 + 0x38 + lVar76);
          auVar100 = *(undefined1 (*) [16])(lVar9 + local_2900 * 4);
          fVar97 = fVar97 - auVar201._0_4_;
          local_2790 = ZEXT416((uint)fVar97);
          lVar9 = *(long *)&pRVar7[*(uint *)(uVar82 + 0x4c + lVar76)].ptr[2].numPrimitives;
          lVar91 = *(long *)(lVar9 + lVar91);
          uVar93 = (ulong)*(uint *)(uVar82 + 0xc + lVar76);
          auVar201 = *(undefined1 (*) [16])(lVar91 + uVar93 * 4);
          local_2930 = (ulong)*(uint *)(uVar82 + 0x1c + lVar76);
          auVar5 = *(undefined1 (*) [16])(lVar91 + local_2930 * 4);
          auVar52 = vunpcklps_avx(auVar123,auVar138);
          auVar138 = vunpckhps_avx(auVar123,auVar138);
          auVar53 = vunpcklps_avx(auVar137,auVar201);
          auVar137 = vunpckhps_avx(auVar137,auVar201);
          uVar94 = (ulong)*(uint *)(uVar82 + 0x2c + lVar76);
          auVar123 = *(undefined1 (*) [16])(lVar91 + uVar94 * 4);
          _local_27b0 = vunpcklps_avx(auVar138,auVar137);
          _local_27f0 = vunpcklps_avx(auVar52,auVar53);
          _local_27d0 = vunpckhps_avx(auVar52,auVar53);
          auVar138 = vunpcklps_avx(auVar114,auVar124);
          auVar137 = vunpckhps_avx(auVar114,auVar124);
          auVar124 = vunpcklps_avx(auVar98,auVar5);
          auVar98 = vunpckhps_avx(auVar98,auVar5);
          local_2928 = (ulong)*(uint *)(uVar82 + 0x3c + lVar76);
          auVar114 = *(undefined1 (*) [16])(lVar91 + local_2928 * 4);
          _local_27a0 = vunpcklps_avx(auVar137,auVar98);
          _local_27e0 = vunpcklps_avx(auVar138,auVar124);
          _local_27c0 = vunpckhps_avx(auVar138,auVar124);
          auVar98 = vunpcklps_avx(auVar99,auVar144);
          auVar99 = vunpckhps_avx(auVar99,auVar144);
          auVar138 = vunpcklps_avx(auVar133,auVar123);
          auVar137 = vunpckhps_avx(auVar133,auVar123);
          lVar79 = (long)(iVar78 + 1) * 0x38;
          lVar91 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar79);
          auVar123 = *(undefined1 (*) [16])(lVar91 + (ulong)*(uint *)(uVar82 + lVar76) * 4);
          auVar133 = vunpcklps_avx(auVar99,auVar137);
          _local_2820 = vunpcklps_avx(auVar98,auVar138);
          _local_2810 = vunpckhps_avx(auVar98,auVar138);
          auVar137 = vunpcklps_avx(auVar150,auVar100);
          auVar99 = vunpckhps_avx(auVar150,auVar100);
          auVar98 = vunpcklps_avx(auVar134,auVar114);
          auVar150 = vunpckhps_avx(auVar134,auVar114);
          lVar83 = *(long *)(lVar83 + lVar79);
          auVar114 = *(undefined1 (*) [16])(lVar83 + uVar89 * 4);
          auVar134 = vunpcklps_avx(auVar99,auVar150);
          auVar138 = vunpcklps_avx(auVar137,auVar98);
          _local_2800 = vunpckhps_avx(auVar137,auVar98);
          lVar10 = *(long *)(local_2918 + lVar79);
          auVar150 = vunpcklps_avx(auVar123,auVar114);
          auVar99 = vunpckhps_avx(auVar123,auVar114);
          auVar123 = *(undefined1 (*) [16])(lVar10 + local_2908 * 4);
          lVar9 = *(long *)(lVar9 + lVar79);
          auVar114 = *(undefined1 (*) [16])(lVar9 + uVar93 * 4);
          auVar137 = vunpcklps_avx(auVar123,auVar114);
          auVar123 = vunpckhps_avx(auVar123,auVar114);
          auVar124 = vunpcklps_avx(auVar99,auVar123);
          auVar144 = vunpcklps_avx(auVar150,auVar137);
          auVar99 = vunpckhps_avx(auVar150,auVar137);
          auVar123 = *(undefined1 (*) [16])(lVar91 + uVar80 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar83 + local_2920 * 4);
          auVar137 = vunpcklps_avx(auVar123,auVar114);
          auVar150 = vunpckhps_avx(auVar123,auVar114);
          auVar123 = *(undefined1 (*) [16])(lVar10 + local_28f8 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar9 + local_2930 * 4);
          auVar98 = vunpcklps_avx(auVar123,auVar114);
          auVar123 = vunpckhps_avx(auVar123,auVar114);
          auVar100 = vunpcklps_avx(auVar150,auVar123);
          auVar201 = vunpcklps_avx(auVar137,auVar98);
          auVar150 = vunpckhps_avx(auVar137,auVar98);
          auVar123 = *(undefined1 (*) [16])(lVar91 + uVar86 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar83 + local_2910 * 4);
          auVar98 = vunpcklps_avx(auVar123,auVar114);
          auVar137 = vunpckhps_avx(auVar123,auVar114);
          auVar123 = *(undefined1 (*) [16])(lVar10 + local_28f0 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar9 + uVar94 * 4);
          auVar5 = vunpcklps_avx(auVar123,auVar114);
          auVar123 = vunpckhps_avx(auVar123,auVar114);
          auVar52 = vunpcklps_avx(auVar137,auVar123);
          auVar53 = vunpcklps_avx(auVar98,auVar5);
          auVar137 = vunpckhps_avx(auVar98,auVar5);
          auVar123 = *(undefined1 (*) [16])(lVar91 + uVar87 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar83 + local_2900 * 4);
          auVar5 = vunpcklps_avx(auVar123,auVar114);
          auVar98 = vunpckhps_avx(auVar123,auVar114);
          auVar123 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
          auVar114 = *(undefined1 (*) [16])(lVar9 + local_2928 * 4);
          auVar54 = vunpcklps_avx(auVar123,auVar114);
          auVar123 = vunpckhps_avx(auVar123,auVar114);
          auVar55 = vunpcklps_avx(auVar98,auVar123);
          auVar56 = vunpcklps_avx(auVar5,auVar54);
          auVar98 = vunpckhps_avx(auVar5,auVar54);
          auVar123 = vshufps_avx(local_2790,local_2790,0);
          auVar114 = ZEXT416((uint)(1.0 - fVar97));
          auVar114 = vshufps_avx(auVar114,auVar114,0);
          fVar97 = auVar123._0_4_;
          fVar108 = auVar123._4_4_;
          fVar109 = auVar123._8_4_;
          fVar110 = auVar123._12_4_;
          fVar111 = auVar114._0_4_;
          fVar112 = auVar114._4_4_;
          fVar113 = auVar114._8_4_;
          fVar122 = auVar114._12_4_;
          auVar142._4_4_ = fVar112 * (float)local_27f0._4_4_ + auVar144._4_4_ * fVar108;
          auVar142._0_4_ = fVar111 * (float)local_27f0._0_4_ + auVar144._0_4_ * fVar97;
          auVar142._8_4_ = fVar113 * fStack_27e8 + auVar144._8_4_ * fVar109;
          auVar142._12_4_ = fVar122 * fStack_27e4 + auVar144._12_4_ * fVar110;
          auVar151._4_4_ = fVar112 * (float)local_27d0._4_4_ + fVar108 * auVar99._4_4_;
          auVar151._0_4_ = fVar111 * (float)local_27d0._0_4_ + fVar97 * auVar99._0_4_;
          auVar151._8_4_ = fVar113 * fStack_27c8 + fVar109 * auVar99._8_4_;
          auVar151._12_4_ = fVar122 * fStack_27c4 + fVar110 * auVar99._12_4_;
          auVar183._4_4_ = fVar112 * (float)local_27b0._4_4_ + auVar124._4_4_ * fVar108;
          auVar183._0_4_ = fVar111 * (float)local_27b0._0_4_ + auVar124._0_4_ * fVar97;
          auVar183._8_4_ = fVar113 * fStack_27a8 + auVar124._8_4_ * fVar109;
          auVar183._12_4_ = fVar122 * fStack_27a4 + auVar124._12_4_ * fVar110;
          auVar144._0_4_ = fVar111 * (float)local_27e0._0_4_ + fVar97 * auVar201._0_4_;
          auVar144._4_4_ = fVar112 * (float)local_27e0._4_4_ + fVar108 * auVar201._4_4_;
          auVar144._8_4_ = fVar113 * fStack_27d8 + fVar109 * auVar201._8_4_;
          auVar144._12_4_ = fVar122 * fStack_27d4 + fVar110 * auVar201._12_4_;
          auVar124._0_4_ = fVar111 * (float)local_27c0._0_4_ + auVar150._0_4_ * fVar97;
          auVar124._4_4_ = fVar112 * (float)local_27c0._4_4_ + auVar150._4_4_ * fVar108;
          auVar124._8_4_ = fVar113 * fStack_27b8 + auVar150._8_4_ * fVar109;
          auVar124._12_4_ = fVar122 * fStack_27b4 + auVar150._12_4_ * fVar110;
          auVar201._0_4_ = fVar111 * (float)local_27a0._0_4_ + auVar100._0_4_ * fVar97;
          auVar201._4_4_ = fVar112 * (float)local_27a0._4_4_ + auVar100._4_4_ * fVar108;
          auVar201._8_4_ = fVar113 * fStack_2798 + auVar100._8_4_ * fVar109;
          auVar201._12_4_ = fVar122 * fStack_2794 + auVar100._12_4_ * fVar110;
          auVar142._20_4_ = fVar112 * (float)local_2820._4_4_ + fVar108 * auVar53._4_4_;
          auVar142._16_4_ = fVar111 * (float)local_2820._0_4_ + fVar97 * auVar53._0_4_;
          auVar142._24_4_ = fVar113 * fStack_2818 + fVar109 * auVar53._8_4_;
          auVar142._28_4_ = fVar122 * fStack_2814 + fVar110 * auVar53._12_4_;
          auVar151._20_4_ = fVar112 * (float)local_2810._4_4_ + auVar137._4_4_ * fVar108;
          auVar151._16_4_ = fVar111 * (float)local_2810._0_4_ + auVar137._0_4_ * fVar97;
          auVar151._24_4_ = fVar113 * fStack_2808 + auVar137._8_4_ * fVar109;
          auVar151._28_4_ = fVar122 * fStack_2804 + auVar137._12_4_ * fVar110;
          local_2960 = auVar133._0_4_;
          fStack_295c = auVar133._4_4_;
          fStack_2958 = auVar133._8_4_;
          fStack_2954 = auVar133._12_4_;
          auVar183._20_4_ = fVar112 * fStack_295c + auVar52._4_4_ * fVar108;
          auVar183._16_4_ = fVar111 * local_2960 + auVar52._0_4_ * fVar97;
          auVar183._24_4_ = fVar113 * fStack_2958 + auVar52._8_4_ * fVar109;
          fVar165 = fVar122 * fStack_2954 + auVar52._12_4_ * fVar110;
          auVar183._28_4_ = fVar165;
          lVar83 = uVar82 + 0x40 + lVar76;
          local_23c0 = *(undefined8 *)(lVar83 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar83 + 0x18);
          auVar133._0_4_ = auVar138._0_4_ * fVar111 + fVar97 * auVar56._0_4_;
          auVar133._4_4_ = auVar138._4_4_ * fVar112 + fVar108 * auVar56._4_4_;
          auVar133._8_4_ = auVar138._8_4_ * fVar113 + fVar109 * auVar56._8_4_;
          auVar133._12_4_ = auVar138._12_4_ * fVar122 + fVar110 * auVar56._12_4_;
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar76 = uVar82 + 0x50 + lVar76;
          local_2780 = *(undefined8 *)(lVar76 + 0x10);
          uStack_2778 = *(undefined8 *)(lVar76 + 0x18);
          auVar138._0_4_ = fVar111 * (float)local_2800._0_4_ + fVar97 * auVar98._0_4_;
          auVar138._4_4_ = fVar112 * (float)local_2800._4_4_ + fVar108 * auVar98._4_4_;
          auVar138._8_4_ = fVar113 * fStack_27f8 + fVar109 * auVar98._8_4_;
          auVar138._12_4_ = fVar122 * fStack_27f4 + fVar110 * auVar98._12_4_;
          local_2970 = auVar134._0_4_;
          fStack_296c = auVar134._4_4_;
          fStack_2968 = auVar134._8_4_;
          fStack_2964 = auVar134._12_4_;
          auVar98._0_4_ = fVar111 * local_2970 + fVar97 * auVar55._0_4_;
          auVar98._4_4_ = fVar112 * fStack_296c + fVar108 * auVar55._4_4_;
          auVar98._8_4_ = fVar113 * fStack_2968 + fVar109 * auVar55._8_4_;
          auVar98._12_4_ = fVar122 * fStack_2964 + fVar110 * auVar55._12_4_;
          uStack_2770 = local_2780;
          uStack_2768 = uStack_2778;
          auVar117._16_16_ = auVar144;
          auVar117._0_16_ = auVar144;
          auVar126._16_16_ = auVar124;
          auVar126._0_16_ = auVar124;
          auVar145._16_16_ = auVar201;
          auVar145._0_16_ = auVar201;
          auVar160._16_16_ = auVar133;
          auVar160._0_16_ = auVar133;
          auVar140._16_16_ = auVar138;
          auVar140._0_16_ = auVar138;
          auVar101._16_16_ = auVar98;
          auVar101._0_16_ = auVar98;
          auVar115 = vsubps_avx(auVar142,auVar117);
          auVar129 = vsubps_avx(auVar151,auVar126);
          auVar47 = vsubps_avx(auVar183,auVar145);
          auVar48 = vsubps_avx(auVar160,auVar142);
          auVar49 = vsubps_avx(auVar140,auVar151);
          auVar50 = vsubps_avx(auVar101,auVar183);
          fVar110 = auVar129._0_4_;
          fVar185 = auVar50._0_4_;
          fVar148 = auVar129._4_4_;
          fVar187 = auVar50._4_4_;
          auVar141._4_4_ = fVar187 * fVar148;
          auVar141._0_4_ = fVar185 * fVar110;
          fVar17 = auVar129._8_4_;
          fVar188 = auVar50._8_4_;
          auVar141._8_4_ = fVar188 * fVar17;
          fVar23 = auVar129._12_4_;
          fVar189 = auVar50._12_4_;
          auVar141._12_4_ = fVar189 * fVar23;
          fVar29 = auVar129._16_4_;
          fVar190 = auVar50._16_4_;
          auVar141._16_4_ = fVar190 * fVar29;
          fVar35 = auVar129._20_4_;
          fVar191 = auVar50._20_4_;
          auVar141._20_4_ = fVar191 * fVar35;
          fVar41 = auVar129._24_4_;
          fVar192 = auVar50._24_4_;
          auVar141._24_4_ = fVar192 * fVar41;
          auVar141._28_4_ = auVar98._12_4_;
          fVar111 = auVar47._0_4_;
          fVar175 = auVar49._0_4_;
          fVar12 = auVar47._4_4_;
          fVar177 = auVar49._4_4_;
          auVar59._4_4_ = fVar177 * fVar12;
          auVar59._0_4_ = fVar175 * fVar111;
          fVar18 = auVar47._8_4_;
          fVar178 = auVar49._8_4_;
          auVar59._8_4_ = fVar178 * fVar18;
          fVar24 = auVar47._12_4_;
          fVar179 = auVar49._12_4_;
          auVar59._12_4_ = fVar179 * fVar24;
          fVar30 = auVar47._16_4_;
          fVar180 = auVar49._16_4_;
          auVar59._16_4_ = fVar180 * fVar30;
          fVar36 = auVar47._20_4_;
          fVar181 = auVar49._20_4_;
          auVar59._20_4_ = fVar181 * fVar36;
          fVar42 = auVar47._24_4_;
          fVar182 = auVar49._24_4_;
          auVar59._24_4_ = fVar182 * fVar42;
          auVar59._28_4_ = auVar144._12_4_;
          local_2640 = vsubps_avx(auVar59,auVar141);
          fVar159 = auVar48._0_4_;
          fVar162 = auVar48._4_4_;
          auVar60._4_4_ = fVar162 * fVar12;
          auVar60._0_4_ = fVar159 * fVar111;
          fVar163 = auVar48._8_4_;
          auVar60._8_4_ = fVar163 * fVar18;
          fVar166 = auVar48._12_4_;
          auVar60._12_4_ = fVar166 * fVar24;
          fVar168 = auVar48._16_4_;
          auVar60._16_4_ = fVar168 * fVar30;
          fVar170 = auVar48._20_4_;
          auVar60._20_4_ = fVar170 * fVar36;
          fVar172 = auVar48._24_4_;
          auVar60._24_4_ = fVar172 * fVar42;
          auVar60._28_4_ = auVar144._12_4_;
          fVar193 = auVar115._0_4_;
          fVar195 = auVar115._4_4_;
          auVar61._4_4_ = fVar195 * fVar187;
          auVar61._0_4_ = fVar193 * fVar185;
          fVar196 = auVar115._8_4_;
          auVar61._8_4_ = fVar196 * fVar188;
          fVar197 = auVar115._12_4_;
          auVar61._12_4_ = fVar197 * fVar189;
          fVar198 = auVar115._16_4_;
          auVar61._16_4_ = fVar198 * fVar190;
          fVar199 = auVar115._20_4_;
          auVar61._20_4_ = fVar199 * fVar191;
          fVar200 = auVar115._24_4_;
          auVar61._24_4_ = fVar200 * fVar192;
          auVar61._28_4_ = auVar124._12_4_;
          auVar115 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar195 * fVar177;
          auVar62._0_4_ = fVar193 * fVar175;
          auVar62._8_4_ = fVar196 * fVar178;
          auVar62._12_4_ = fVar197 * fVar179;
          auVar62._16_4_ = fVar198 * fVar180;
          auVar62._20_4_ = fVar199 * fVar181;
          auVar62._24_4_ = fVar200 * fVar182;
          auVar62._28_4_ = auVar124._12_4_;
          auVar63._4_4_ = fVar162 * fVar148;
          auVar63._0_4_ = fVar159 * fVar110;
          auVar63._8_4_ = fVar163 * fVar17;
          auVar63._12_4_ = fVar166 * fVar23;
          auVar63._16_4_ = fVar168 * fVar29;
          auVar63._20_4_ = fVar170 * fVar35;
          auVar63._24_4_ = fVar172 * fVar41;
          auVar63._28_4_ = auVar138._12_4_;
          uVar3 = *(undefined4 *)(ray + k * 4);
          auVar194._4_4_ = uVar3;
          auVar194._0_4_ = uVar3;
          auVar194._8_4_ = uVar3;
          auVar194._12_4_ = uVar3;
          auVar194._16_4_ = uVar3;
          auVar194._20_4_ = uVar3;
          auVar194._24_4_ = uVar3;
          auVar194._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar202._4_4_ = uVar3;
          auVar202._0_4_ = uVar3;
          auVar202._8_4_ = uVar3;
          auVar202._12_4_ = uVar3;
          auVar202._16_4_ = uVar3;
          auVar202._20_4_ = uVar3;
          auVar202._24_4_ = uVar3;
          auVar202._28_4_ = uVar3;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar203._4_4_ = uVar4;
          auVar203._0_4_ = uVar4;
          auVar203._8_4_ = uVar4;
          auVar203._12_4_ = uVar4;
          auVar203._16_4_ = uVar4;
          auVar203._20_4_ = uVar4;
          auVar203._24_4_ = uVar4;
          auVar203._28_4_ = uVar4;
          fVar97 = *(float *)(ray + k * 4 + 0x50);
          local_28e0 = vsubps_avx(auVar63,auVar62);
          in_ZMM5 = ZEXT3264(local_28e0);
          local_2880 = vsubps_avx(auVar142,auVar194);
          fVar108 = *(float *)(ray + k * 4 + 0x60);
          auVar129 = vsubps_avx(auVar151,auVar202);
          auVar47 = vsubps_avx(auVar183,auVar203);
          fVar149 = auVar47._0_4_;
          fVar153 = auVar47._4_4_;
          auVar64._4_4_ = fVar153 * fVar97;
          auVar64._0_4_ = fVar149 * fVar97;
          fVar154 = auVar47._8_4_;
          auVar64._8_4_ = fVar154 * fVar97;
          fVar155 = auVar47._12_4_;
          auVar64._12_4_ = fVar155 * fVar97;
          fVar156 = auVar47._16_4_;
          auVar64._16_4_ = fVar156 * fVar97;
          fVar157 = auVar47._20_4_;
          auVar64._20_4_ = fVar157 * fVar97;
          fVar158 = auVar47._24_4_;
          auVar64._24_4_ = fVar158 * fVar97;
          auVar64._28_4_ = fVar165;
          fVar112 = auVar129._0_4_;
          fVar13 = auVar129._4_4_;
          auVar65._4_4_ = fVar108 * fVar13;
          auVar65._0_4_ = fVar108 * fVar112;
          fVar19 = auVar129._8_4_;
          auVar65._8_4_ = fVar108 * fVar19;
          fVar25 = auVar129._12_4_;
          auVar65._12_4_ = fVar108 * fVar25;
          fVar31 = auVar129._16_4_;
          auVar65._16_4_ = fVar108 * fVar31;
          fVar37 = auVar129._20_4_;
          auVar65._20_4_ = fVar108 * fVar37;
          fVar43 = auVar129._24_4_;
          auVar65._24_4_ = fVar108 * fVar43;
          auVar65._28_4_ = uVar3;
          auVar129 = vsubps_avx(auVar65,auVar64);
          fVar109 = *(float *)(ray + k * 4 + 0x40);
          fVar113 = local_2880._0_4_;
          fVar14 = local_2880._4_4_;
          auVar66._4_4_ = fVar108 * fVar14;
          auVar66._0_4_ = fVar108 * fVar113;
          fVar20 = local_2880._8_4_;
          auVar66._8_4_ = fVar108 * fVar20;
          fVar26 = local_2880._12_4_;
          auVar66._12_4_ = fVar108 * fVar26;
          fVar32 = local_2880._16_4_;
          auVar66._16_4_ = fVar108 * fVar32;
          fVar38 = local_2880._20_4_;
          auVar66._20_4_ = fVar108 * fVar38;
          fVar44 = local_2880._24_4_;
          auVar66._24_4_ = fVar108 * fVar44;
          auVar66._28_4_ = uVar4;
          auVar67._4_4_ = fVar153 * fVar109;
          auVar67._0_4_ = fVar149 * fVar109;
          auVar67._8_4_ = fVar154 * fVar109;
          auVar67._12_4_ = fVar155 * fVar109;
          auVar67._16_4_ = fVar156 * fVar109;
          auVar67._20_4_ = fVar157 * fVar109;
          auVar67._24_4_ = fVar158 * fVar109;
          auVar67._28_4_ = auVar144._12_4_;
          auVar47 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = fVar109 * fVar13;
          auVar68._0_4_ = fVar109 * fVar112;
          auVar68._8_4_ = fVar109 * fVar19;
          auVar68._12_4_ = fVar109 * fVar25;
          auVar68._16_4_ = fVar109 * fVar31;
          auVar68._20_4_ = fVar109 * fVar37;
          auVar68._24_4_ = fVar109 * fVar43;
          auVar68._28_4_ = uVar4;
          auVar69._4_4_ = fVar14 * fVar97;
          auVar69._0_4_ = fVar113 * fVar97;
          auVar69._8_4_ = fVar20 * fVar97;
          auVar69._12_4_ = fVar26 * fVar97;
          auVar69._16_4_ = fVar32 * fVar97;
          auVar69._20_4_ = fVar38 * fVar97;
          auVar69._24_4_ = fVar44 * fVar97;
          auVar69._28_4_ = local_2880._28_4_;
          auVar51 = vsubps_avx(auVar69,auVar68);
          local_2860._0_4_ = auVar115._0_4_;
          local_2860._4_4_ = auVar115._4_4_;
          fStack_2858 = auVar115._8_4_;
          fStack_2854 = auVar115._12_4_;
          fStack_2850 = auVar115._16_4_;
          fStack_284c = auVar115._20_4_;
          fStack_2848 = auVar115._24_4_;
          uStack_2844 = auVar115._28_4_;
          fVar122 = local_28e0._0_4_;
          fVar15 = local_28e0._4_4_;
          fVar21 = local_28e0._8_4_;
          fVar27 = local_28e0._12_4_;
          fVar33 = local_28e0._16_4_;
          fVar39 = local_28e0._20_4_;
          fVar45 = local_28e0._24_4_;
          fVar165 = local_2640._0_4_;
          fVar16 = local_2640._4_4_;
          fVar22 = local_2640._8_4_;
          fVar28 = local_2640._12_4_;
          fVar34 = local_2640._16_4_;
          fVar40 = local_2640._20_4_;
          fVar46 = local_2640._24_4_;
          auVar102._0_4_ = fVar109 * fVar165 + fVar108 * fVar122 + (float)local_2860._0_4_ * fVar97;
          auVar102._4_4_ = fVar109 * fVar16 + fVar108 * fVar15 + (float)local_2860._4_4_ * fVar97;
          auVar102._8_4_ = fVar109 * fVar22 + fVar108 * fVar21 + fStack_2858 * fVar97;
          auVar102._12_4_ = fVar109 * fVar28 + fVar108 * fVar27 + fStack_2854 * fVar97;
          auVar102._16_4_ = fVar109 * fVar34 + fVar108 * fVar33 + fStack_2850 * fVar97;
          auVar102._20_4_ = fVar109 * fVar40 + fVar108 * fVar39 + fStack_284c * fVar97;
          auVar102._24_4_ = fVar109 * fVar46 + fVar108 * fVar45 + fStack_2848 * fVar97;
          auVar102._28_4_ = fVar108 + fVar108 + fVar97;
          auVar127._8_4_ = 0x80000000;
          auVar127._0_8_ = 0x8000000080000000;
          auVar127._12_4_ = 0x80000000;
          auVar127._16_4_ = 0x80000000;
          auVar127._20_4_ = 0x80000000;
          auVar127._24_4_ = 0x80000000;
          auVar127._28_4_ = 0x80000000;
          auVar115 = vandps_avx(auVar102,auVar127);
          uVar90 = auVar115._0_4_;
          local_26c0._0_4_ =
               (float)(uVar90 ^ (uint)(fVar159 * auVar129._0_4_ +
                                      fVar185 * auVar51._0_4_ + fVar175 * auVar47._0_4_));
          uVar74 = auVar115._4_4_;
          local_26c0._4_4_ =
               (float)(uVar74 ^ (uint)(fVar162 * auVar129._4_4_ +
                                      fVar187 * auVar51._4_4_ + fVar177 * auVar47._4_4_));
          uVar164 = auVar115._8_4_;
          local_26c0._8_4_ =
               (float)(uVar164 ^
                      (uint)(fVar163 * auVar129._8_4_ +
                            fVar188 * auVar51._8_4_ + fVar178 * auVar47._8_4_));
          uVar167 = auVar115._12_4_;
          local_26c0._12_4_ =
               (float)(uVar167 ^
                      (uint)(fVar166 * auVar129._12_4_ +
                            fVar189 * auVar51._12_4_ + fVar179 * auVar47._12_4_));
          uVar169 = auVar115._16_4_;
          local_26c0._16_4_ =
               (float)(uVar169 ^
                      (uint)(fVar168 * auVar129._16_4_ +
                            fVar190 * auVar51._16_4_ + fVar180 * auVar47._16_4_));
          uVar171 = auVar115._20_4_;
          local_26c0._20_4_ =
               (float)(uVar171 ^
                      (uint)(fVar170 * auVar129._20_4_ +
                            fVar191 * auVar51._20_4_ + fVar181 * auVar47._20_4_));
          uVar173 = auVar115._24_4_;
          local_26c0._24_4_ =
               (float)(uVar173 ^
                      (uint)(fVar172 * auVar129._24_4_ +
                            fVar192 * auVar51._24_4_ + fVar182 * auVar47._24_4_));
          uVar174 = auVar115._28_4_;
          local_26c0._28_4_ =
               (float)(uVar174 ^ (uint)(auVar48._28_4_ + auVar50._28_4_ + auVar49._28_4_));
          auVar132 = ZEXT3264(local_26c0);
          local_26a0._0_4_ =
               (float)(uVar90 ^ (uint)(auVar129._0_4_ * fVar193 +
                                      fVar111 * auVar51._0_4_ + fVar110 * auVar47._0_4_));
          local_26a0._4_4_ =
               (float)(uVar74 ^ (uint)(auVar129._4_4_ * fVar195 +
                                      fVar12 * auVar51._4_4_ + fVar148 * auVar47._4_4_));
          local_26a0._8_4_ =
               (float)(uVar164 ^
                      (uint)(auVar129._8_4_ * fVar196 +
                            fVar18 * auVar51._8_4_ + fVar17 * auVar47._8_4_));
          local_26a0._12_4_ =
               (float)(uVar167 ^
                      (uint)(auVar129._12_4_ * fVar197 +
                            fVar24 * auVar51._12_4_ + fVar23 * auVar47._12_4_));
          local_26a0._16_4_ =
               (float)(uVar169 ^
                      (uint)(auVar129._16_4_ * fVar198 +
                            fVar30 * auVar51._16_4_ + fVar29 * auVar47._16_4_));
          local_26a0._20_4_ =
               (float)(uVar171 ^
                      (uint)(auVar129._20_4_ * fVar199 +
                            fVar36 * auVar51._20_4_ + fVar35 * auVar47._20_4_));
          local_26a0._24_4_ =
               (float)(uVar173 ^
                      (uint)(auVar129._24_4_ * fVar200 +
                            fVar42 * auVar51._24_4_ + fVar41 * auVar47._24_4_));
          local_26a0._28_4_ = (float)(uVar174 ^ (uint)(auVar51._28_4_ + auVar47._28_4_ + -0.0));
          in_ZMM4 = ZEXT3264(local_26a0);
          auVar129 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar115 = vcmpps_avx(local_26c0,auVar129,5);
          auVar129 = vcmpps_avx(local_26a0,auVar129,5);
          auVar115 = vandps_avx(auVar115,auVar129);
          auVar128._8_4_ = 0x7fffffff;
          auVar128._0_8_ = 0x7fffffff7fffffff;
          auVar128._12_4_ = 0x7fffffff;
          auVar128._16_4_ = 0x7fffffff;
          auVar128._20_4_ = 0x7fffffff;
          auVar128._24_4_ = 0x7fffffff;
          auVar128._28_4_ = 0x7fffffff;
          local_2660 = vandps_avx(auVar102,auVar128);
          auVar129 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar102,4);
          auVar115 = vandps_avx(auVar115,auVar129);
          auVar103._0_4_ = local_26c0._0_4_ + local_26a0._0_4_;
          auVar103._4_4_ = local_26c0._4_4_ + local_26a0._4_4_;
          auVar103._8_4_ = local_26c0._8_4_ + local_26a0._8_4_;
          auVar103._12_4_ = local_26c0._12_4_ + local_26a0._12_4_;
          auVar103._16_4_ = local_26c0._16_4_ + local_26a0._16_4_;
          auVar103._20_4_ = local_26c0._20_4_ + local_26a0._20_4_;
          auVar103._24_4_ = local_26c0._24_4_ + local_26a0._24_4_;
          auVar103._28_4_ = local_26c0._28_4_ + local_26a0._28_4_;
          auVar129 = vcmpps_avx(auVar103,local_2660,2);
          auVar47 = auVar129 & auVar115;
          if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar47 >> 0x7f,0) != '\0') ||
                (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar47 >> 0xbf,0) != '\0') ||
              (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar47[0x1f] < '\0') {
            auVar115 = vandps_avx(auVar115,auVar129);
            auVar123 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            local_2680._0_4_ =
                 (float)(uVar90 ^ (uint)(fVar165 * fVar113 +
                                        (float)local_2860._0_4_ * fVar112 + fVar149 * fVar122));
            local_2680._4_4_ =
                 (float)(uVar74 ^ (uint)(fVar16 * fVar14 +
                                        (float)local_2860._4_4_ * fVar13 + fVar153 * fVar15));
            local_2680._8_4_ =
                 (float)(uVar164 ^ (uint)(fVar22 * fVar20 + fStack_2858 * fVar19 + fVar154 * fVar21)
                        );
            local_2680._12_4_ =
                 (float)(uVar167 ^ (uint)(fVar28 * fVar26 + fStack_2854 * fVar25 + fVar155 * fVar27)
                        );
            local_2680._16_4_ =
                 (float)(uVar169 ^ (uint)(fVar34 * fVar32 + fStack_2850 * fVar31 + fVar156 * fVar33)
                        );
            local_2680._20_4_ =
                 (float)(uVar171 ^ (uint)(fVar40 * fVar38 + fStack_284c * fVar37 + fVar157 * fVar39)
                        );
            local_2680._24_4_ =
                 (float)(uVar173 ^ (uint)(fVar46 * fVar44 + fStack_2848 * fVar43 + fVar158 * fVar45)
                        );
            local_2680._28_4_ = uVar174 ^ 0x7fc00000;
            fVar97 = *(float *)(ray + k * 4 + 0x30);
            fVar108 = local_2660._0_4_;
            fVar109 = local_2660._4_4_;
            auVar70._4_4_ = fVar109 * fVar97;
            auVar70._0_4_ = fVar108 * fVar97;
            fVar110 = local_2660._8_4_;
            auVar70._8_4_ = fVar110 * fVar97;
            fVar111 = local_2660._12_4_;
            auVar70._12_4_ = fVar111 * fVar97;
            fVar112 = local_2660._16_4_;
            auVar70._16_4_ = fVar112 * fVar97;
            fVar113 = local_2660._20_4_;
            auVar70._20_4_ = fVar113 * fVar97;
            fVar148 = local_2660._24_4_;
            auVar70._24_4_ = fVar148 * fVar97;
            auVar70._28_4_ = fVar97;
            auVar115 = vcmpps_avx(auVar70,local_2680,1);
            fVar97 = *(float *)(ray + k * 4 + 0x80);
            auVar143 = ZEXT3264(CONCAT428(fVar97,CONCAT424(fVar97,CONCAT420(fVar97,CONCAT416(fVar97,
                                                  CONCAT412(fVar97,CONCAT48(fVar97,CONCAT44(fVar97,
                                                  fVar97))))))));
            auVar71._4_4_ = fVar97 * fVar109;
            auVar71._0_4_ = fVar97 * fVar108;
            auVar71._8_4_ = fVar97 * fVar110;
            auVar71._12_4_ = fVar97 * fVar111;
            auVar71._16_4_ = fVar97 * fVar112;
            auVar71._20_4_ = fVar97 * fVar113;
            auVar71._24_4_ = fVar97 * fVar148;
            auVar71._28_4_ = 0x7fffffff;
            auVar129 = vcmpps_avx(local_2680,auVar71,2);
            auVar115 = vandps_avx(auVar115,auVar129);
            auVar114 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar123 = vpand_avx(auVar114,auVar123);
            auVar114 = vpmovzxwd_avx(auVar123);
            auVar150 = vpslld_avx(auVar114,0x1f);
            auVar99 = vpsrad_avx(auVar150,0x1f);
            auVar114 = vpunpckhwd_avx(auVar123,auVar123);
            auVar114 = vpslld_avx(auVar114,0x1f);
            auVar114 = vpsrad_avx(auVar114,0x1f);
            local_2840._16_16_ = auVar114;
            local_2840._0_16_ = auVar99;
            in_ZMM5 = ZEXT3264(local_2840);
            if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_2840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2840 >> 0x7f,0) != '\0') ||
                  (local_2840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar114 >> 0x3f,0) != '\0') ||
                (local_2840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar114[0xf] < '\0') {
              local_2620 = (float)local_2860._0_4_;
              fStack_261c = (float)local_2860._4_4_;
              fStack_2618 = fStack_2858;
              fStack_2614 = fStack_2854;
              fStack_2610 = fStack_2850;
              fStack_260c = fStack_284c;
              fStack_2608 = fStack_2848;
              uStack_2604 = uStack_2844;
              local_2600 = local_28e0;
              local_25e0 = local_2840;
              local_2500 = local_24c0;
              auVar129 = vrcpps_avx(local_2660);
              fVar97 = auVar129._0_4_;
              auVar118._0_4_ = fVar108 * fVar97;
              fVar108 = auVar129._4_4_;
              auVar118._4_4_ = fVar109 * fVar108;
              fVar109 = auVar129._8_4_;
              auVar118._8_4_ = fVar110 * fVar109;
              fVar110 = auVar129._12_4_;
              auVar118._12_4_ = fVar111 * fVar110;
              fVar111 = auVar129._16_4_;
              auVar118._16_4_ = fVar112 * fVar111;
              fVar112 = auVar129._20_4_;
              auVar118._20_4_ = fVar113 * fVar112;
              fVar113 = auVar129._24_4_;
              auVar118._24_4_ = fVar148 * fVar113;
              auVar118._28_4_ = 0;
              auVar146._8_4_ = 0x3f800000;
              auVar146._0_8_ = 0x3f8000003f800000;
              auVar146._12_4_ = 0x3f800000;
              auVar146._16_4_ = 0x3f800000;
              auVar146._20_4_ = 0x3f800000;
              auVar146._24_4_ = 0x3f800000;
              auVar146._28_4_ = 0x3f800000;
              auVar47 = vsubps_avx(auVar146,auVar118);
              fVar97 = fVar97 + fVar97 * auVar47._0_4_;
              fVar108 = fVar108 + fVar108 * auVar47._4_4_;
              fVar109 = fVar109 + fVar109 * auVar47._8_4_;
              fVar110 = fVar110 + fVar110 * auVar47._12_4_;
              fVar111 = fVar111 + fVar111 * auVar47._16_4_;
              fVar112 = fVar112 + fVar112 * auVar47._20_4_;
              fVar113 = fVar113 + fVar113 * auVar47._24_4_;
              local_2580._4_4_ = local_2680._4_4_ * fVar108;
              local_2580._0_4_ = local_2680._0_4_ * fVar97;
              local_2580._8_4_ = local_2680._8_4_ * fVar109;
              local_2580._12_4_ = local_2680._12_4_ * fVar110;
              local_2580._16_4_ = local_2680._16_4_ * fVar111;
              local_2580._20_4_ = local_2680._20_4_ * fVar112;
              local_2580._24_4_ = local_2680._24_4_ * fVar113;
              local_2580._28_4_ = local_2680._28_4_;
              auVar147 = ZEXT3264(local_2580);
              auVar72._4_4_ = fVar108 * local_26c0._4_4_;
              auVar72._0_4_ = fVar97 * local_26c0._0_4_;
              auVar72._8_4_ = fVar109 * local_26c0._8_4_;
              auVar72._12_4_ = fVar110 * local_26c0._12_4_;
              auVar72._16_4_ = fVar111 * local_26c0._16_4_;
              auVar72._20_4_ = fVar112 * local_26c0._20_4_;
              auVar72._24_4_ = fVar113 * local_26c0._24_4_;
              auVar72._28_4_ = auVar47._28_4_;
              auVar115 = vminps_avx(auVar72,auVar146);
              auVar73._4_4_ = fVar108 * local_26a0._4_4_;
              auVar73._0_4_ = fVar97 * local_26a0._0_4_;
              auVar73._8_4_ = fVar109 * local_26a0._8_4_;
              auVar73._12_4_ = fVar110 * local_26a0._12_4_;
              auVar73._16_4_ = fVar111 * local_26a0._16_4_;
              auVar73._20_4_ = fVar112 * local_26a0._20_4_;
              auVar73._24_4_ = fVar113 * local_26a0._24_4_;
              auVar73._28_4_ = auVar129._28_4_ + auVar47._28_4_;
              auVar129 = vminps_avx(auVar73,auVar146);
              auVar47 = vsubps_avx(auVar146,auVar115);
              auVar48 = vsubps_avx(auVar146,auVar129);
              local_25a0 = vblendvps_avx(auVar129,auVar47,local_24c0);
              local_25c0 = vblendvps_avx(auVar115,auVar48,local_24c0);
              local_2560[0] = fVar165 * (float)local_24e0._0_4_;
              local_2560[1] = fVar16 * (float)local_24e0._4_4_;
              local_2560[2] = fVar22 * fStack_24d8;
              local_2560[3] = fVar28 * fStack_24d4;
              fStack_2550 = fVar34 * fStack_24d0;
              fStack_254c = fVar40 * fStack_24cc;
              fStack_2548 = fVar46 * fStack_24c8;
              uStack_2544 = local_25c0._28_4_;
              local_2540[0] = (float)local_2860._0_4_ * (float)local_24e0._0_4_;
              local_2540[1] = (float)local_2860._4_4_ * (float)local_24e0._4_4_;
              local_2540[2] = fStack_2858 * fStack_24d8;
              local_2540[3] = fStack_2854 * fStack_24d4;
              fStack_2530 = fStack_2850 * fStack_24d0;
              fStack_252c = fStack_284c * fStack_24cc;
              fStack_2528 = fStack_2848 * fStack_24c8;
              uStack_2524 = auVar115._28_4_;
              local_2520[0] = fVar122 * (float)local_24e0._0_4_;
              local_2520[1] = fVar15 * (float)local_24e0._4_4_;
              local_2520[2] = fVar21 * fStack_24d8;
              local_2520[3] = fVar27 * fStack_24d4;
              fStack_2510 = fVar33 * fStack_24d0;
              fStack_250c = fVar39 * fStack_24cc;
              fStack_2508 = fVar45 * fStack_24c8;
              uStack_2504 = uStack_24c4;
              auVar114 = vpunpckhwd_avx(auVar123,auVar123);
              auVar114 = vpslld_avx(auVar114,0x1f);
              auVar104._16_16_ = auVar114;
              auVar104._0_16_ = auVar150;
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar115 = vblendvps_avx(auVar119,local_2580,auVar104);
              auVar129 = vshufps_avx(auVar115,auVar115,0xb1);
              auVar129 = vminps_avx(auVar115,auVar129);
              auVar47 = vshufpd_avx(auVar129,auVar129,5);
              auVar129 = vminps_avx(auVar129,auVar47);
              auVar47 = vperm2f128_avx(auVar129,auVar129,1);
              auVar129 = vminps_avx(auVar129,auVar47);
              auVar115 = vcmpps_avx(auVar115,auVar129,0);
              auVar114 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar123 = vpand_avx(auVar114,auVar123);
              auVar114 = vpmovzxwd_avx(auVar123);
              auVar114 = vpslld_avx(auVar114,0x1f);
              auVar114 = vpsrad_avx(auVar114,0x1f);
              auVar123 = vpunpckhwd_avx(auVar123,auVar123);
              auVar123 = vpslld_avx(auVar123,0x1f);
              auVar123 = vpsrad_avx(auVar123,0x1f);
              auVar105._16_16_ = auVar123;
              auVar105._0_16_ = auVar114;
              if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar105 >> 0x7f,0) == '\0') &&
                    (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar123 >> 0x3f,0) == '\0') &&
                  (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar123[0xf]) {
                auVar105 = local_2840;
              }
              uVar74 = vmovmskps_avx(auVar105);
              uVar90 = 0;
              if (uVar74 != 0) {
                for (; (uVar74 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
LAB_00415f77:
              auVar132 = ZEXT3264(auVar48);
              uVar93 = CONCAT44(0,uVar90);
              uVar90 = *(uint *)((long)&local_23c0 + uVar93 * 4);
              pGVar8 = (pSVar6->geometries).items[uVar90].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2840 + uVar93 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar3 = *(undefined4 *)(local_25c0 + uVar93 * 4);
                  uVar4 = *(undefined4 *)(local_25a0 + uVar93 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_2560[uVar93 - 8];
                  *(float *)(ray + k * 4 + 0xc0) = local_2560[uVar93];
                  *(float *)(ray + k * 4 + 0xd0) = local_2540[uVar93];
                  *(float *)(ray + k * 4 + 0xe0) = local_2520[uVar93];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_2780 + uVar93 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar90;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_00415d48;
                }
                _local_2860 = auVar147._0_32_;
                uVar3 = *(undefined4 *)(local_25c0 + uVar93 * 4);
                local_2720._4_4_ = uVar3;
                local_2720._0_4_ = uVar3;
                local_2720._8_4_ = uVar3;
                local_2720._12_4_ = uVar3;
                local_2710 = *(undefined4 *)(local_25a0 + uVar93 * 4);
                local_26f0 = vpshufd_avx(ZEXT416(uVar90),0);
                uVar3 = *(undefined4 *)((long)&local_2780 + uVar93 * 4);
                local_2700._4_4_ = uVar3;
                local_2700._0_4_ = uVar3;
                local_2700._8_4_ = uVar3;
                local_2700._12_4_ = uVar3;
                auVar132 = ZEXT1664(local_2700);
                fVar97 = local_2560[uVar93];
                auVar134._4_4_ = fVar97;
                auVar134._0_4_ = fVar97;
                auVar134._8_4_ = fVar97;
                auVar134._12_4_ = fVar97;
                in_ZMM4 = ZEXT1664(auVar134);
                fVar108 = local_2540[uVar93];
                local_2740._4_4_ = fVar108;
                local_2740._0_4_ = fVar108;
                local_2740._8_4_ = fVar108;
                local_2740._12_4_ = fVar108;
                in_ZMM5 = ZEXT1664(local_2740);
                fVar108 = local_2520[uVar93];
                local_2730._4_4_ = fVar108;
                local_2730._0_4_ = fVar108;
                local_2730._8_4_ = fVar108;
                local_2730._12_4_ = fVar108;
                local_2750[0] = (RTCHitN)SUB41(fVar97,0);
                local_2750[1] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_2750[2] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_2750[3] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_2750[4] = (RTCHitN)SUB41(fVar97,0);
                local_2750[5] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_2750[6] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_2750[7] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_2750[8] = (RTCHitN)SUB41(fVar97,0);
                local_2750[9] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_2750[10] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_2750[0xb] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_2750[0xc] = (RTCHitN)SUB41(fVar97,0);
                local_2750[0xd] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_2750[0xe] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_2750[0xf] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                uStack_270c = local_2710;
                uStack_2708 = local_2710;
                uStack_2704 = local_2710;
                vcmpps_avx(ZEXT1632(local_2720),ZEXT1632(local_2720),0xf);
                uStack_26dc = context->user->instID[0];
                local_26e0 = uStack_26dc;
                uStack_26d8 = uStack_26dc;
                uStack_26d4 = uStack_26dc;
                uStack_26d0 = context->user->instPrimID[0];
                uStack_26cc = uStack_26d0;
                uStack_26c8 = uStack_26d0;
                uStack_26c4 = uStack_26d0;
                local_28e0._0_8_ = uVar93;
                *(float *)(ray + k * 4 + 0x80) = local_2560[uVar93 - 8];
                local_2950 = *local_2940;
                local_28b0.valid = (int *)local_2950;
                local_28b0.geometryUserPtr = pGVar8->userPtr;
                local_28b0.context = context->user;
                local_28b0.hit = local_2750;
                local_28b0.N = 4;
                local_2880._0_8_ = pGVar8;
                local_28b0.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar132 = ZEXT1664(local_2700);
                  in_ZMM4 = ZEXT1664(auVar134);
                  in_ZMM5 = ZEXT1664(local_2740);
                  (*pGVar8->intersectionFilterN)(&local_28b0);
                }
                if (local_2950 == (undefined1  [16])0x0) {
                  auVar123 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar123 = auVar123 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_2880._0_8_ + 0x3e) & 0x40) != 0)))) {
                    auVar132 = ZEXT1664(auVar132._0_16_);
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                    (*p_Var11)(&local_28b0);
                  }
                  auVar114 = vpcmpeqd_avx(local_2950,_DAT_01f7aa10);
                  auVar123 = auVar114 ^ _DAT_01f7ae20;
                  if (local_2950 != (undefined1  [16])0x0) {
                    auVar114 = auVar114 ^ _DAT_01f7ae20;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])local_28b0.hit);
                    *(undefined1 (*) [16])(local_28b0.ray + 0xc0) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0xd0) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0xe0) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0xf0) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0x100) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0x110) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0x120) = auVar99;
                    auVar99 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_28b0.ray + 0x130) = auVar99;
                    auVar114 = vmaskmovps_avx(auVar114,*(undefined1 (*) [16])(local_28b0.hit + 0x80)
                                             );
                    *(undefined1 (*) [16])(local_28b0.ray + 0x140) = auVar114;
                  }
                }
                auVar100._8_8_ = 0x100000001;
                auVar100._0_8_ = 0x100000001;
                if ((auVar100 & auVar123) == (undefined1  [16])0x0) {
                  local_29a0._0_4_ = auVar143._0_4_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_29a0._0_4_;
                  local_29a0 = auVar143._0_32_;
                }
                else {
                  local_29a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2840 + local_28e0._0_8_ * 4) = 0;
                auVar143 = ZEXT3264(local_29a0);
                auVar123 = vshufps_avx(local_29a0._0_16_,local_29a0._0_16_,0);
                auVar106._16_16_ = auVar123;
                auVar106._0_16_ = auVar123;
                auVar147 = ZEXT3264(_local_2860);
                auVar115 = vcmpps_avx(_local_2860,auVar106,2);
                local_2840 = vandps_avx(auVar115,local_2840);
              }
              if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2840 >> 0x7f,0) == '\0') &&
                    (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2840 >> 0xbf,0) == '\0') &&
                  (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2840[0x1f]) goto LAB_00415d48;
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar115 = vblendvps_avx(auVar120,auVar147._0_32_,local_2840);
              auVar129 = vshufps_avx(auVar115,auVar115,0xb1);
              auVar129 = vminps_avx(auVar115,auVar129);
              auVar47 = vshufpd_avx(auVar129,auVar129,5);
              auVar129 = vminps_avx(auVar129,auVar47);
              auVar48 = vperm2f128_avx(auVar129,auVar129,1);
              auVar129 = vminps_avx(auVar129,auVar48);
              auVar129 = vcmpps_avx(auVar115,auVar129,0);
              auVar47 = local_2840 & auVar129;
              auVar115 = local_2840;
              if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar47 >> 0x7f,0) != '\0') ||
                    (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar47 >> 0xbf,0) != '\0') ||
                  (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar47[0x1f] < '\0') {
                auVar115 = vandps_avx(auVar129,local_2840);
              }
              uVar74 = vmovmskps_avx(auVar115);
              uVar90 = 0;
              if (uVar74 != 0) {
                for (; (uVar74 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
              goto LAB_00415f77;
            }
          }
LAB_00415d48:
          lVar77 = lVar77 + 1;
        } while (lVar77 != local_2938);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar107 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      auVar143 = ZEXT3264(local_23e0);
      auVar147 = ZEXT3264(local_2400);
      auVar152 = ZEXT3264(local_2420);
      auVar161 = ZEXT3264(local_2440);
      auVar176 = ZEXT3264(local_2460);
      auVar184 = ZEXT3264(local_2480);
      auVar186 = ZEXT3264(local_24a0);
    }
    if (pauVar75 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }